

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildSystemCommand.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_38da3::BasicBuildSystemFrontendDelegate::~BasicBuildSystemFrontendDelegate
          (BasicBuildSystemFrontendDelegate *this)

{
  FileSystem *pFVar1;
  
  (this->super_BuildSystemFrontendDelegate).super_BuildSystemDelegate._vptr_BuildSystemDelegate =
       (_func_int **)&PTR__BasicBuildSystemFrontendDelegate_0020a5a8;
  sigaction(2,(sigaction *)&this->previousSigintHandler,(sigaction *)0x0);
  llbuild::basic::sys::close(DAT_002118f4);
  DAT_002118f4 = -1;
  pFVar1 = (this->fileSystem)._M_t.
           super___uniq_ptr_impl<llbuild::basic::FileSystem,_std::default_delete<llbuild::basic::FileSystem>_>
           ._M_t.
           super__Tuple_impl<0UL,_llbuild::basic::FileSystem_*,_std::default_delete<llbuild::basic::FileSystem>_>
           .super__Head_base<0UL,_llbuild::basic::FileSystem_*,_false>._M_head_impl;
  if (pFVar1 != (FileSystem *)0x0) {
    (*pFVar1->_vptr_FileSystem[1])();
  }
  (this->fileSystem)._M_t.
  super___uniq_ptr_impl<llbuild::basic::FileSystem,_std::default_delete<llbuild::basic::FileSystem>_>
  ._M_t.
  super__Tuple_impl<0UL,_llbuild::basic::FileSystem_*,_std::default_delete<llbuild::basic::FileSystem>_>
  .super__Head_base<0UL,_llbuild::basic::FileSystem_*,_false>._M_head_impl = (FileSystem *)0x0;
  llbuild::buildsystem::BuildSystemFrontendDelegate::~BuildSystemFrontendDelegate
            (&this->super_BuildSystemFrontendDelegate);
  return;
}

Assistant:

~BasicBuildSystemFrontendDelegate() {
    // Restore any previous SIGINT handler.
#if defined(_WIN32)
    signal(SIGINT, previousSigintHandler);
#else
    sigaction(SIGINT, &previousSigintHandler, NULL);
#endif

    // Close the signal watching pipe.
    basic::sys::close(BasicBuildSystemFrontendDelegate::signalWatchingPipe[1]);
    signalWatchingPipe[1] = -1;
  }